

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

DictionaryTypeHandler * __thiscall
Js::SimpleTypeHandler<2UL>::ConvertToDictionaryType
          (SimpleTypeHandler<2UL> *this,DynamicObject *instance)

{
  int *piVar1;
  DictionaryTypeHandlerBase<unsigned_short> *pDVar2;
  
  pDVar2 = SimpleTypeHandler<2ul>::
           ConvertToTypeHandler<Js::DictionaryTypeHandlerBase<unsigned_short>>
                     ((SimpleTypeHandler<2ul> *)this,instance);
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->convertSimpleToDictionaryCount;
  *piVar1 = *piVar1 + 1;
  return pDVar2;
}

Assistant:

DictionaryTypeHandler* SimpleTypeHandler<size>::ConvertToDictionaryType(DynamicObject* instance)
    {
        DictionaryTypeHandler* newTypeHandler = ConvertToTypeHandler<DictionaryTypeHandler>(instance);

#ifdef PROFILE_TYPES
        instance->GetScriptContext()->convertSimpleToDictionaryCount++;
#endif
        return newTypeHandler;
    }